

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LedgerFormats.cpp
# Opt level: O0

void __thiscall jbcoin::LedgerFormats::addCommonFields(LedgerFormats *this,Item *item)

{
  Item *pIVar1;
  SOElement local_48;
  SOElement local_38;
  SOElement local_28;
  Item *local_18;
  Item *item_local;
  LedgerFormats *this_local;
  
  local_18 = item;
  item_local = (Item *)this;
  SOElement::SOElement(&local_28,(SField *)sfLedgerIndex,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(item,&local_28);
  SOElement::SOElement(&local_38,(SField *)sfLedgerEntryType,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_38);
  SOElement::SOElement(&local_48,(SField *)sfFlags,SOE_REQUIRED);
  KnownFormats<jbcoin::LedgerEntryType>::Item::operator<<(pIVar1,&local_48);
  return;
}

Assistant:

void LedgerFormats::addCommonFields (Item& item)
{
    item
        << SOElement(sfLedgerIndex,             SOE_OPTIONAL)
        << SOElement(sfLedgerEntryType,         SOE_REQUIRED)
        << SOElement(sfFlags,                   SOE_REQUIRED)
        ;
}